

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool QApplicationPrivate::sendMouseEvent
               (QWidget *receiver,QMouseEvent *event,QWidget *alienWidget,QWidget *nativeWidget,
               QWidget **buttonDown,QPointer<QWidget> *lastMouseReceiver,bool spontaneous,
               bool onlyDispatchEnterLeave)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  Type TVar4;
  WId WVar5;
  QWidget *pQVar6;
  long in_RDX;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long *in_R8;
  long in_FS_OFFSET;
  QPointF QVar7;
  byte in_stack_00000008;
  byte in_stack_00000010;
  QWidget *enter;
  bool result;
  bool wasLeaveAfterRelease;
  bool widgetUnderMouse;
  bool graphicsWidget;
  QPointer<QWidget> activePopupWidget;
  QPointer<QWidget> alienGuard;
  QPointer<QWidget> nativeGuard;
  QPointer<QWidget> receiverGuard;
  QWidget *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  WidgetAttribute in_stack_fffffffffffffe34;
  QWidget *in_stack_fffffffffffffe38;
  QRectF *in_stack_fffffffffffffe40;
  QWidget *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 uVar8;
  bool local_162;
  bool local_161;
  byte local_13e;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::MouseButton> in_stack_ffffffffffffff3c;
  QWidget *in_stack_ffffffffffffff40;
  QWidget *in_stack_ffffffffffffff48;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_98;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_94;
  QPointF local_90;
  QRect local_80;
  undefined1 local_70 [32];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if ((in_RDX != 0) &&
     (bVar1 = isAlien((QWidget *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
     !bVar1)) {
    local_10 = 0;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::activePopupWidget();
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  bVar1 = QWidget::testAttribute(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
  local_80 = QWidget::rect(in_stack_fffffffffffffe48);
  QRectF::QRectF(in_stack_fffffffffffffe40,(QRect *)in_stack_fffffffffffffe38);
  local_90 = QSinglePointEvent::position((QSinglePointEvent *)0x2cfeae);
  bVar2 = QRectF::contains((QPointF *)local_70);
  bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2cfeea);
  local_161 = false;
  if ((bVar3) && (local_161 = false, *in_R8 == 0)) {
    local_94.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QSinglePointEvent::buttons
                   ((QSinglePointEvent *)
                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    local_161 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_94);
  }
  if (local_161 != false) {
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
  }
  if (*in_R8 == 0) {
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d0028);
    if ((bVar3) && ((bVar2 & 1) != 0)) {
      if ((local_10 == 0) ||
         (bVar3 = ::operator!=((QWidget **)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               (QPointer<QWidget> *)in_stack_fffffffffffffe28), !bVar3)) {
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d0070);
        bVar3 = isAlien((QWidget *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        if ((!bVar3) || (local_10 != 0)) goto LAB_002d0187;
      }
      bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d009d);
      if (bVar3) {
        pQVar6 = QWidget::mouseGrabber();
        if (pQVar6 == (QWidget *)0x0) {
          ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d00ef);
          QSinglePointEvent::globalPosition((QSinglePointEvent *)0x2d0101);
          dispatchEnterLeave(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                             (QPointF *)
                             CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
        }
      }
      else {
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d0146);
        QVar7 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x2d0158);
        in_stack_ffffffffffffff48 = (QWidget *)QVar7.xp;
        dispatchEnterLeave(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           (QPointF *)
                           CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
      }
    }
  }
  else if (!bVar1) {
    if ((((local_10 != 0) || (WVar5 = QWidget::internalWinId(in_RDI), WVar5 == 0)) &&
        (bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2cff96), !bVar3)) &&
       (pQVar6 = QWidget::mouseGrabber(), pQVar6 == (QWidget *)0x0)) {
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28);
    }
    TVar4 = QEvent::type(in_RSI);
    local_162 = false;
    if (TVar4 == MouseButtonRelease) {
      local_98.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QSinglePointEvent::buttons
                     ((QSinglePointEvent *)
                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_162 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_98);
    }
    if (local_162 != false) {
      *in_R8 = 0;
    }
  }
LAB_002d0187:
  pQVar6 = (QWidget *)0x0;
  bVar3 = ::operator!=((QPointer<QWidget> *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (nullptr_t *)in_stack_fffffffffffffe28);
  local_13e = 1;
  if ((in_stack_00000010 & 1) == 0) {
    if ((in_stack_00000008 & 1) == 0) {
      local_13e = QCoreApplication::sendEvent(&in_RDI->super_QObject,in_RSI);
    }
    else {
      local_13e = QCoreApplication::sendSpontaneousEvent(&in_RDI->super_QObject,in_RSI);
    }
    local_13e = local_13e & 1;
  }
  uVar8 = false;
  if (!bVar1) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d022c);
    uVar8 = false;
    if (bVar1) {
      TVar4 = QEvent::type(in_RSI);
      uVar8 = false;
      if (TVar4 == MouseButtonRelease) {
        in_stack_ffffffffffffff3c.i =
             (Int)QSinglePointEvent::buttons
                            ((QSinglePointEvent *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        bVar1 = QFlags<Qt::MouseButton>::operator!
                          ((QFlags<Qt::MouseButton> *)&stack0xffffffffffffff3c);
        uVar8 = false;
        if (bVar1) {
          QWidget::mouseGrabber();
          uVar8 = ::operator!=((QWidget **)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               (QPointer<QWidget> *)in_stack_fffffffffffffe28);
        }
      }
    }
  }
  if ((bool)uVar8 == false) {
    if (!bVar3) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d03f6);
      if (bVar1) {
        pQVar6 = QWidget::mouseGrabber();
        if (pQVar6 == (QWidget *)0x0) {
          bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d0414);
          if (!bVar1) {
            ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d0436);
          }
          QPointer<QWidget>::operator=
                    ((QPointer<QWidget> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28);
        }
      }
      else {
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d047f);
        if (!bVar1) {
          QSinglePointEvent::globalPosition((QSinglePointEvent *)0x2d04a1);
          QPointF::toPoint((QPointF *)in_stack_fffffffffffffe40);
          QApplication::widgetAt((QPoint *)CONCAT17(uVar8,in_stack_fffffffffffffe68));
        }
        QPointer<QWidget>::operator=
                  ((QPointer<QWidget> *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28);
      }
    }
  }
  else {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d02d0);
    if (bVar1) {
      ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d02e3);
    }
    else {
      QSinglePointEvent::globalPosition((QSinglePointEvent *)0x2d0321);
      QPointF::toPoint((QPointF *)in_stack_fffffffffffffe40);
      QApplication::widgetAt((QPoint *)CONCAT17(uVar8,in_stack_fffffffffffffe68));
    }
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d0376);
    QSinglePointEvent::globalPosition((QSinglePointEvent *)0x2d0388);
    dispatchEnterLeave(in_stack_ffffffffffffff48,pQVar6,
                       (QPointF *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
  }
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2d0508);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2d0515);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2d0522);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2d052f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_13e & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QApplicationPrivate::sendMouseEvent(QWidget *receiver, QMouseEvent *event,
                                         QWidget *alienWidget, QWidget *nativeWidget,
                                         QWidget **buttonDown, QPointer<QWidget> &lastMouseReceiver,
                                         bool spontaneous, bool onlyDispatchEnterLeave)
{
    Q_ASSERT(receiver);
    Q_ASSERT(event);
    Q_ASSERT(nativeWidget);
    Q_ASSERT(buttonDown);

    if (alienWidget && !isAlien(alienWidget))
        alienWidget = nullptr;

    QPointer<QWidget> receiverGuard = receiver;
    QPointer<QWidget> nativeGuard = nativeWidget;
    QPointer<QWidget> alienGuard = alienWidget;
    QPointer<QWidget> activePopupWidget = QApplication::activePopupWidget();

    const bool graphicsWidget = nativeWidget->testAttribute(Qt::WA_DontShowOnScreen);

    bool widgetUnderMouse = QRectF(receiver->rect()).contains(event->position());

    // Clear the obsolete leaveAfterRelease value, if mouse button has been released but
    // leaveAfterRelease has not been updated.
    // This happens e.g. when modal dialog or popup is shown as a response to button click.
    if (leaveAfterRelease && !*buttonDown && !event->buttons())
        leaveAfterRelease = nullptr;

    if (*buttonDown) {
        if (!graphicsWidget) {
            // Register the widget that shall receive a leave event
            // after the last button is released.
            if ((alienWidget || !receiver->internalWinId()) && !leaveAfterRelease && !QWidget::mouseGrabber())
                leaveAfterRelease = *buttonDown;
            if (event->type() == QEvent::MouseButtonRelease && !event->buttons())
                *buttonDown = nullptr;
        }
    } else if (lastMouseReceiver && widgetUnderMouse) {
        // Dispatch enter/leave if we move:
        // 1) from an alien widget to another alien widget or
        //    from a native widget to an alien widget (first OR case)
        // 2) from an alien widget to a native widget (second OR case)
        if ((alienWidget && alienWidget != lastMouseReceiver)
            || (isAlien(lastMouseReceiver) && !alienWidget)) {
            if (activePopupWidget) {
                if (!QWidget::mouseGrabber())
                    dispatchEnterLeave(alienWidget ? alienWidget : nativeWidget, lastMouseReceiver, event->globalPosition());
            } else {
                dispatchEnterLeave(receiver, lastMouseReceiver, event->globalPosition());
            }

        }
    }

    // We need this quard in case someone opens a modal dialog / popup. If that's the case
    // leaveAfterRelease is set to null, but we shall not update lastMouseReceiver.
    const bool wasLeaveAfterRelease = leaveAfterRelease != nullptr;
    bool result = true;
    // This code is used for sending the synthetic enter/leave events for cases where it is needed
    // due to other events causing the widget under the mouse to change. However in those cases
    // we do not want to send the mouse event associated with this call, so this enables us to
    // not send the unneeded mouse event
    if (!onlyDispatchEnterLeave) {
        if (spontaneous)
            result = QApplication::sendSpontaneousEvent(receiver, event);
        else
            result = QCoreApplication::sendEvent(receiver, event);
    }

    if (!graphicsWidget && leaveAfterRelease && event->type() == QEvent::MouseButtonRelease
        && !event->buttons() && QWidget::mouseGrabber() != leaveAfterRelease) {
        // Dispatch enter/leave if:
        // 1) the mouse grabber is an alien widget
        // 2) the button is released on an alien widget
        QWidget *enter = nullptr;
        if (nativeGuard)
            enter = alienGuard ? alienWidget : nativeWidget;
        else // The receiver is typically deleted on mouse release with drag'n'drop.
            enter = QApplication::widgetAt(event->globalPosition().toPoint());
        dispatchEnterLeave(enter, leaveAfterRelease, event->globalPosition());
        leaveAfterRelease = nullptr;
        lastMouseReceiver = enter;
    } else if (!wasLeaveAfterRelease) {
        if (activePopupWidget) {
            if (!QWidget::mouseGrabber())
                lastMouseReceiver = alienGuard ? alienWidget : (nativeGuard ? nativeWidget : nullptr);
        } else {
            lastMouseReceiver = receiverGuard ? receiver : QApplication::widgetAt(event->globalPosition().toPoint());
        }
    }

    return result;
}